

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O1

int greatest_prng_init_second_pass(int id,unsigned_long seed)

{
  if (greatest_info.prng[id].count == 0) {
    return 0;
  }
  greatest_prng_init_second_pass_cold_1();
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}